

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O3

void __thiscall
CP::priority_queue<int,_bool_(*)(const_int_&,_const_int_&)>::fixDown
          (priority_queue<int,_bool_(*)(const_int_&,_const_int_&)> *this,size_t idx)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  int tmp;
  int local_34;
  long lVar7;
  
  piVar4 = this->mData;
  iVar1 = piVar4[idx];
  uVar5 = idx * 2 + 1;
  uVar3 = this->mSize;
  if (uVar5 < uVar3) {
    lVar7 = idx * 2;
    do {
      uVar6 = lVar7 + 2;
      if (uVar6 < uVar3) {
        bVar2 = (*this->mLess)(piVar4 + uVar5,piVar4 + uVar6);
        if (!bVar2) {
          uVar6 = uVar5;
        }
        uVar5 = uVar6;
        piVar4 = this->mData;
      }
      bVar2 = (*this->mLess)(piVar4 + uVar5,&local_34);
      piVar4 = this->mData;
      if (bVar2) break;
      piVar4[idx] = piVar4[uVar5];
      lVar7 = uVar5 * 2;
      uVar6 = uVar5 * 2 + 1;
      uVar3 = this->mSize;
      idx = uVar5;
      uVar5 = uVar6;
    } while (uVar6 < uVar3);
  }
  piVar4[idx] = iVar1;
  return;
}

Assistant:

void fixDown(size_t idx) {
      T tmp = mData[idx];
      size_t c;
      while ((c = 2 * idx + 1) < mSize) {
        if (c + 1 < mSize && mLess(mData[c],mData[c + 1]) ) c++;
        if ( mLess(mData[c],tmp) ) break;
        mData[idx] = mData[c];
        idx = c;
      }
      mData[idx] = tmp;
    }